

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_false,_false>::unfix_
          (DaTrie<true,_false,_false> *this,uint32_t node_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *in_RDX;
  uint32_t in_ESI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t head;
  uint32_t block_pos;
  uint32_t in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar5 = (ulong)in_ESI;
  sVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size(in_RDI);
  if (sVar6 <= uVar5) {
    __assert_fail("node_pos < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x46a,
                  "void ddd::DaTrie<true, false, false>::unfix_(uint32_t, std::vector<BlockLink> &) [WithBLM = true, WithNLM = false, Prefix = false]"
                 );
  }
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
  bVar1 = Bc::is_fixed(pvVar7);
  if (bVar1) {
    uVar2 = in_ESI >> 8;
    pvVar8 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                       (in_RDX,(ulong)uVar2);
    if (pvVar8->num_emps == 0) {
      set_next_((DaTrie<true,_false,_false> *)
                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      set_prev_((DaTrie<true,_false,_false> *)
                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      uVar3 = in_ESI;
      pvVar8 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                         (in_RDX,(ulong)uVar2);
      pvVar8->head = in_ESI;
      insert_block_link_((DaTrie<true,_false,_false> *)CONCAT44(uVar3,in_stack_fffffffffffffff0),
                         (uint32_t)((ulong)in_RDX >> 0x20),
                         (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)
                         CONCAT44(uVar2,in_stack_ffffffffffffffe0));
      in_ESI = uVar3;
    }
    else {
      std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[](in_RDX,(ulong)uVar2);
      prev_((DaTrie<true,_false,_false> *)
            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc)
      ;
      set_prev_((DaTrie<true,_false,_false> *)
                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      set_next_((DaTrie<true,_false,_false> *)
                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      prev_((DaTrie<true,_false,_false> *)
            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc)
      ;
      set_next_((DaTrie<true,_false,_false> *)
                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      set_prev_((DaTrie<true,_false,_false> *)
                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    }
    pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)in_ESI);
    Bc::unfix(pvVar7);
    *(int *)((long)&in_RDI[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                    super__Vector_impl_data._M_start + 4) =
         *(int *)((long)&in_RDI[4].super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                         super__Vector_impl_data._M_start + 4) + 1;
    pvVar8 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                       (in_RDX,(ulong)uVar2);
    pvVar8->num_emps = pvVar8->num_emps + 1;
    uVar4 = uVar2;
    uVar3 = num_blocks((DaTrie<true,_false,_false> *)0x170b60);
    if (uVar2 == uVar3 - 1) {
      while (pvVar8 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                                (in_RDX,(ulong)uVar4), pvVar8->num_emps == 0x100) {
        pop_block_((DaTrie<true,_false,_false> *)CONCAT44(uVar2,in_stack_ffffffffffffffc0));
        uVar3 = num_blocks((DaTrie<true,_false,_false> *)0x170b9c);
        if (uVar3 == 0) {
          return;
        }
        uVar4 = uVar4 - 1;
      }
    }
    return;
  }
  __assert_fail("bc_[node_pos].is_fixed()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x46b,
                "void ddd::DaTrie<true, false, false>::unfix_(uint32_t, std::vector<BlockLink> &) [WithBLM = true, WithNLM = false, Prefix = false]"
               );
}

Assistant:

void unfix_(uint32_t node_pos, std::vector<BlockLink>& blocks) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());

    auto block_pos = node_pos / BLOCK_SIZE;

    if (blocks[block_pos].num_emps == 0) {
      set_next_(node_pos, node_pos);
      set_prev_(node_pos, node_pos);
      blocks[block_pos].head = node_pos;
      insert_block_link_(block_pos, blocks);
    } else {
      auto head = blocks[block_pos].head;
      set_prev_(node_pos, prev_(head));
      set_next_(node_pos, head);
      set_next_(prev_(head), node_pos);
      set_prev_(head, node_pos);
    }

    bc_[node_pos].unfix();

    ++bc_emps_;
    ++blocks[block_pos].num_emps;

    if (block_pos == num_blocks() - 1) {
      while (blocks[block_pos].num_emps == BLOCK_SIZE) {
        pop_block_();
        if (num_blocks() == 0) {
          break;
        }
        --block_pos;
      }
    }
  }